

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits_container_tests.cpp
# Opt level: O2

bool anon_unknown.dwarf_48993f4::ns::operator==(Value *lhs,Value *rhs)

{
  __type_conflict1 _Var1;
  
  _Var1 = std::operator==(&lhs->name,&rhs->name);
  return _Var1 && lhs->value == rhs->value;
}

Assistant:

bool operator==(const Value& lhs, const Value& rhs)
        {
            return lhs.name == rhs.name && lhs.value == rhs.value;
        }